

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void __thiscall BoolValue::BoolValue(BoolValue *this,bool value)

{
  SimpleType *this_00;
  string *namee;
  allocator<char> local_21;
  
  (this->super_Value).super_Base._vptr_Base = (_func_int **)&PTR_accept_0013b680;
  this->value = value;
  this_00 = (SimpleType *)operator_new(0x18);
  namee = (string *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)namee,"bool",&local_21);
  SimpleType::SimpleType(this_00,namee);
  (this->super_Value).type = this_00;
  return;
}

Assistant:

BoolValue::BoolValue(bool value): value(value)
{
    type = new SimpleType(new std::string("bool"));
}